

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::classify_hinges_by_sharpness
               (Mesh *mesh,Read<signed_char> *hinge_is_exposed,Read<signed_char> *hinge_is_sharp)

{
  Int IVar1;
  uint size_in;
  ulong uVar2;
  Write<signed_char> class_dim;
  undefined1 local_f8 [32];
  long local_d8;
  Write<signed_char> local_d0;
  Write<signed_char> local_c0;
  Write<signed_char> local_b0;
  Write<signed_char> local_a0;
  Int local_90;
  Write<signed_char> local_88;
  Write<signed_char> local_78;
  type f;
  
  IVar1 = Mesh::dim(mesh);
  size_in = Mesh::nents(mesh,IVar1 + -2);
  std::__cxx11::string::string((string *)local_f8,"",(allocator *)&local_a0);
  Write<signed_char>::Write(&class_dim,size_in,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  Write<signed_char>::Write(&f.class_dim,&class_dim);
  f.dim = IVar1;
  Write<signed_char>::Write(&f.hinge_is_exposed.write_,&hinge_is_exposed->write_);
  Write<signed_char>::Write(&f.hinge_is_sharp.write_,&hinge_is_sharp->write_);
  Write<signed_char>::Write(&local_a0,&f.class_dim);
  local_90 = f.dim;
  Write<signed_char>::Write(&local_88,&f.hinge_is_exposed.write_);
  Write<signed_char>::Write(&local_78,&f.hinge_is_sharp.write_);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)local_f8,&local_a0);
    local_f8._16_4_ = local_90;
    Write<signed_char>::Write((Write<signed_char> *)(local_f8 + 0x18),&local_88);
    Write<signed_char>::Write(&local_d0,&local_78);
    entering_parallel = 0;
    for (uVar2 = 0; size_in != uVar2; uVar2 = uVar2 + 1) {
      *(char *)(local_f8._8_8_ + uVar2) =
           (char)local_f8._16_4_ -
           (*(char *)((long)local_d0.shared_alloc_.direct_ptr + uVar2) + *(char *)(local_d8 + uVar2)
           );
    }
    classify_hinges_by_sharpness(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
    ::$_0::~__0((__0 *)local_f8);
  }
  classify_hinges_by_sharpness(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
  ::$_0::~__0((__0 *)&local_a0);
  std::__cxx11::string::string((string *)local_f8,"class_dim",(allocator *)&local_a0);
  Write<signed_char>::Write(&local_c0,&class_dim);
  Read<signed_char>::Read((Read<signed_char> *)&local_b0,&local_c0);
  Mesh::add_tag<signed_char>
            (mesh,IVar1 + -2,(string *)local_f8,1,(Read<signed_char> *)&local_b0,false);
  Write<signed_char>::~Write(&local_b0);
  Write<signed_char>::~Write(&local_c0);
  std::__cxx11::string::~string((string *)local_f8);
  classify_hinges_by_sharpness(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
  ::$_0::~__0((__0 *)&f);
  Write<signed_char>::~Write(&class_dim);
  return;
}

Assistant:

void classify_hinges_by_sharpness(
    Mesh* mesh, Read<I8> hinge_is_exposed, Read<I8> hinge_is_sharp) {
  auto dim = mesh->dim();
  auto nh = mesh->nents(dim - 2);
  Write<I8> class_dim(nh);
  auto f = OMEGA_H_LAMBDA(LO h) {
    class_dim[h] =
        static_cast<I8>(dim - hinge_is_exposed[h] - hinge_is_sharp[h]);
  };
  parallel_for(nh, f, "classify_hinges_by_sharpness");
  mesh->add_tag<I8>(dim - 2, "class_dim", 1, class_dim);
}